

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O3

int __thiscall QDockWidgetPrivate::init(QDockWidgetPrivate *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  QWidget *parent;
  void **ppvVar2;
  Data *pDVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  QDockWidgetLayout *this_00;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar7;
  undefined4 *puVar8;
  QAction *pQVar9;
  long in_FS_OFFSET;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  Connection local_88;
  QString local_80;
  QObject local_68 [8];
  QObject local_60 [8];
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  this_00 = (QDockWidgetLayout *)operator_new(0x48);
  QDockWidgetLayout::QDockWidgetLayout(this_00,parent);
  QLayout::setSizeConstraint((QLayout *)this_00,SetMinAndMaxSize);
  aVar7.m_data = operator_new(0x30);
  QAbstractButton::QAbstractButton((QAbstractButton *)aVar7.m_data,parent);
  *(undefined ***)aVar7.m_data = &PTR_metaObject_007f2098;
  *(undefined ***)((long)aVar7.m_data + 0x10) = &PTR__QDockWidgetTitleButton_007f2260;
  *(undefined4 *)((long)aVar7.m_data + 0x28) = 0xffffffff;
  QWidget::setFocusPolicy((QWidget *)aVar7.m_data,NoFocus);
  QVar10.m_size = (size_t)"qt_dockwidget_floatbutton";
  QVar10.field_0.m_data = aVar7.m_data;
  QObject::setObjectName(QVar10);
  local_58.d.d = (Data *)QAbstractButton::clicked;
  local_58.d.ptr = (char16_t *)0x0;
  local_80.d.d = (Data *)toggleTopLevel;
  local_80.d.ptr = (char16_t *)0x0;
  ppvVar2 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
  puVar8 = (undefined4 *)operator_new(0x20);
  *puVar8 = 1;
  *(code **)(puVar8 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QDockWidgetPrivate::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar8 + 4) = toggleTopLevel;
  *(undefined8 *)(puVar8 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)aVar7.m_data,(QObject *)&local_58,ppvVar2,
             (QSlotObjectBase *)&local_80,(ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  QDockWidgetLayout::setWidgetForRole(this_00,FloatButton,(QWidget *)aVar7.m_data);
  aVar7.m_data = operator_new(0x30);
  QAbstractButton::QAbstractButton((QAbstractButton *)aVar7.m_data,parent);
  *(undefined ***)aVar7.m_data = &PTR_metaObject_007f2098;
  *(undefined ***)((long)aVar7.m_data + 0x10) = &PTR__QDockWidgetTitleButton_007f2260;
  *(undefined4 *)((long)aVar7.m_data + 0x28) = 0xffffffff;
  QWidget::setFocusPolicy((QWidget *)aVar7.m_data,NoFocus);
  QVar11.m_size = (size_t)"qt_dockwidget_closebutton";
  QVar11.field_0.m_data = aVar7.m_data;
  QObject::setObjectName(QVar11);
  local_80.d.d = (Data *)QWidget::close;
  local_80.d.ptr = (char16_t *)0x0;
  local_58.d.d = (Data *)QAbstractButton::clicked;
  local_58.d.ptr = (char16_t *)0x0;
  puVar8 = (undefined4 *)operator_new(0x20);
  *puVar8 = 1;
  *(code **)(puVar8 + 2) =
       QtPrivate::QCallableObject<bool_(QWidget::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar8 + 4) = QWidget::close;
  *(undefined8 *)(puVar8 + 6) = 0;
  QObject::connectImpl
            (local_68,(void **)aVar7.m_data,(QObject *)&local_58,(void **)parent,
             (QSlotObjectBase *)&local_80,(ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  QDockWidgetLayout::setWidgetForRole(this_00,CloseButton,(QWidget *)aVar7.m_data);
  QApplication::font((QApplication *)&local_58,"QDockWidgetTitle");
  pDVar3 = *(Data **)&this->font;
  *(Data **)&this->font = local_58.d.d;
  uVar1 = *(undefined4 *)&this->field_0x270;
  *(undefined4 *)&this->field_0x270 = local_58.d.ptr._0_4_;
  local_58.d.ptr = (char16_t *)CONCAT44(local_58.d.ptr._4_4_,uVar1);
  local_58.d.d = pDVar3;
  QFont::~QFont((QFont *)&local_58);
  pQVar9 = (QAction *)operator_new(0x10);
  QAction::QAction(pQVar9,&parent->super_QObject);
  this->toggleViewAction = pQVar9;
  QAction::setCheckable(SUB81(pQVar9,0));
  QAction::setMenuRole((MenuRole)this->toggleViewAction);
  QWidget::windowTitle(&local_80,parent);
  qt_setWindowTitle_helperHelper(&local_58,&local_80,parent);
  pQVar4 = &((this->fixedWindowTitle).d.d)->super_QArrayData;
  pcVar5 = (this->fixedWindowTitle).d.ptr;
  (this->fixedWindowTitle).d.d = local_58.d.d;
  (this->fixedWindowTitle).d.ptr = local_58.d.ptr;
  qVar6 = (this->fixedWindowTitle).d.size;
  (this->fixedWindowTitle).d.size = local_58.d.size;
  local_58.d.d = (Data *)pQVar4;
  local_58.d.ptr = pcVar5;
  local_58.d.size = qVar6;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
    }
  }
  QAction::setText((QString *)this->toggleViewAction);
  pQVar9 = this->toggleViewAction;
  local_58.d.d = (Data *)QAction::triggered;
  local_58.d.ptr = (char16_t *)0x0;
  local_80.d.d = (Data *)toggleView;
  local_80.d.ptr = (char16_t *)0x0;
  ppvVar2 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
  puVar8 = (undefined4 *)operator_new(0x20);
  *puVar8 = 1;
  *(code **)(puVar8 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QDockWidgetPrivate::*)(bool),_QtPrivate::List<bool>,_void>::impl;
  *(code **)(puVar8 + 4) = toggleView;
  *(undefined8 *)(puVar8 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_88,(void **)pQVar9,(QObject *)&local_58,ppvVar2,
             (QSlotObjectBase *)&local_80,(ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_88);
  updateButtons(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QDockWidgetPrivate::init()
{
    Q_Q(QDockWidget);

    QDockWidgetLayout *layout = new QDockWidgetLayout(q);
    layout->setSizeConstraint(QLayout::SetMinAndMaxSize);

    QAbstractButton *button = new QDockWidgetTitleButton(q);
    button->setObjectName("qt_dockwidget_floatbutton"_L1);
    QObjectPrivate::connect(button, &QAbstractButton::clicked,
                            this, &QDockWidgetPrivate::toggleTopLevel);
    layout->setWidgetForRole(QDockWidgetLayout::FloatButton, button);

    button = new QDockWidgetTitleButton(q);
    button->setObjectName("qt_dockwidget_closebutton"_L1);
    QObject::connect(button, &QAbstractButton::clicked, q, &QDockWidget::close);
    layout->setWidgetForRole(QDockWidgetLayout::CloseButton, button);

    font = QApplication::font("QDockWidgetTitle");

#ifndef QT_NO_ACTION
    toggleViewAction = new QAction(q);
    toggleViewAction->setCheckable(true);
    toggleViewAction->setMenuRole(QAction::NoRole);
    fixedWindowTitle = qt_setWindowTitle_helperHelper(q->windowTitle(), q);
    toggleViewAction->setText(fixedWindowTitle);
    QObjectPrivate::connect(toggleViewAction, &QAction::triggered,
                            this, &QDockWidgetPrivate::toggleView);
#endif

    updateButtons();
}